

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void __thiscall NavierStokesBase::velocity_advection(NavierStokesBase *this,Real dt)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  pointer pSVar1;
  int iVar2;
  TimeCenter TVar3;
  int iVar4;
  MultiFab *dst;
  FabArray<amrex::FArrayBox> *this_00;
  MultiFab *src;
  int *piVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  Real time;
  double dVar16;
  Box force_bx;
  Box state_bx;
  MFIter U_mfi_1;
  MFIter U_mfi;
  MultiFab visc_terms;
  FillPatchIterator U_fpi;
  MultiFab forcing_term;
  FillPatchIterator Rho_fpi;
  long local_ae0;
  long local_ad8;
  long local_ad0;
  long local_ab8;
  long local_ab0;
  Array4<double> local_a40;
  Box local_9fc;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_9e0;
  long local_9d8;
  long local_9d0;
  long local_9c8;
  long local_9c0;
  Array4<const_double> local_9b8;
  MFIter local_978;
  Array4<const_double> local_918;
  undefined1 local_8d8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_8c8;
  int local_8b0;
  FabArray<amrex::FArrayBox> local_750;
  undefined1 local_5d0 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avStack_5c0 [5];
  FabArray<amrex::FArrayBox> local_548;
  FabArray<amrex::FArrayBox> local_3c0;
  undefined1 local_240 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avStack_230 [5];
  FabArray<amrex::FArrayBox> local_1b8;
  
  if (verbose != 0) {
    if (do_mom_diff == 0) {
      local_5d0._8_8_ = amrex::OutStream();
      local_5d0._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
      local_5d0._0_4_ = *(int *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)avStack_5c0);
      *(undefined8 *)
       ((long)&avStack_5c0[0].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       avStack_5c0[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
           *(undefined8 *)
            ((long)&(((BoxArray *)(local_5d0._8_8_ + 8))->m_bat).m_bat_type +
            (long)(*(_func_int ***)local_5d0._8_8_)[-3]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)avStack_5c0,"... advect velocities\n",0x16);
    }
    else {
      local_5d0._8_8_ = amrex::OutStream();
      local_5d0._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
      local_5d0._0_4_ = *(int *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)avStack_5c0);
      *(undefined8 *)
       ((long)&avStack_5c0[0].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       avStack_5c0[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
           *(undefined8 *)
            ((long)&(((BoxArray *)(local_5d0._8_8_ + 8))->m_bat).m_bat_type +
            (long)(*(_func_int ***)local_5d0._8_8_)[-3]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)avStack_5c0,"... advect momenta\n",0x13);
    }
    amrex::Print::~Print((Print *)local_5d0);
  }
  pSVar1 = (this->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  TVar3 = amrex::StateDescriptor::timeType(pSVar1->desc);
  if (TVar3 == Point) {
    time = (pSVar1->old_time).stop;
  }
  else {
    time = ((pSVar1->old_time).start + (pSVar1->old_time).stop) * 0.5;
  }
  iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
  dst = getDivCond(this,(uint)(iVar4 != 0),time);
  bxs = &(this->super_AmrLevel).grids;
  dm = &(this->super_AmrLevel).dmap;
  iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
  local_5d0._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  local_5d0._8_8_ = (FabArrayBase *)0x0;
  avStack_5c0[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_5c0[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_5c0[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            ((MultiFab *)&local_3c0,bxs,dm,3,(uint)(iVar4 != 0),(MFInfo *)local_5d0,
             (this->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_5c0);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&local_3c0,0.0,0,local_3c0.super_FabArrayBase.n_comp,
             &local_3c0.super_FabArrayBase.n_grow);
  iVar4 = nghost_state(this);
  amrex::FillPatchIterator::FillPatchIterator
            ((FillPatchIterator *)local_5d0,&this->super_AmrLevel,(MultiFab *)&local_3c0,iVar4,time,
             0,0,3);
  this_00 = &local_548;
  if (do_mom_diff != 0) {
    this_00 = (FabArray<amrex::FArrayBox> *)operator_new(0x180);
    iVar4 = nghost_state(this);
    local_240._0_8_ =
         (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
    local_240._8_8_ = (FabArrayBase *)0x0;
    avStack_230[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    avStack_230[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    avStack_230[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::MultiFab
              ((MultiFab *)this_00,bxs,dm,3,iVar4,(MFInfo *)local_240,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(avStack_230);
    if (do_mom_diff != 0) {
      iVar4 = nghost_state(this);
      amrex::FillPatchIterator::FillPatchIterator
                ((FillPatchIterator *)local_240,&this->super_AmrLevel,(MultiFab *)&local_3c0,iVar4,
                 time,0,3,1);
      amrex::MFIter::MFIter((MFIter *)local_8d8,&local_548.super_FabArrayBase,true);
      if ((int)vStack_8c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage < local_8b0) {
        do {
          iVar4 = nghost_state(this);
          amrex::MFIter::growntilebox((Box *)&local_9b8,(MFIter *)local_8d8,iVar4);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&local_750,&local_1b8,(MFIter *)local_8d8);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&local_978,&local_548,(MFIter *)local_8d8);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_a40,this_00,(MFIter *)local_8d8);
          lVar12 = (long)local_9b8.p._4_4_;
          lVar10 = (long)(int)local_9b8.p;
          local_ae0 = (lVar12 - local_a40.begin.y) * local_a40.jstride * 8 + lVar10 * 8 +
                      (long)local_a40.begin.x * -8 + CONCAT71(local_a40.p._1_7_,local_a40.p._0_1_);
          local_ad0 = (lVar12 - local_978.beginIndex) * (long)local_978.fabArray * 8 + lVar10 * 8 +
                      (long)local_978.currentIndex * -8 +
                      (long)local_978.m_fa._M_t.
                            super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
          lVar9 = 0;
          do {
            iVar4 = (int)local_9b8.jstride;
            if ((int)local_9b8.jstride <= local_9b8.kstride._4_4_) {
              do {
                if (local_9b8.p._4_4_ <= (int)local_9b8.kstride) {
                  lVar7 = (long)iVar4;
                  lVar6 = (lVar7 - local_a40.begin.z) * local_a40.kstride * 8 + local_ae0;
                  lVar11 = (long)local_750.super_FabArrayBase._vptr_FabArrayBase +
                           (lVar7 - local_750.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                                    m_loshft.vect[2]) *
                           local_750.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ * 8 +
                           (lVar12 - local_750.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                                     m_loshft.vect[1]) *
                           local_750.super_FabArrayBase.boxarray.m_bat._0_8_ * 8 + lVar10 * 8 +
                           (long)local_750.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                                 m_loshft.vect[0] * -8;
                  lVar8 = (lVar7 - local_978.endIndex) * local_978.tile_size.vect._0_8_ * 8 +
                          local_ad0;
                  lVar7 = lVar12;
                  do {
                    if ((int)local_9b8.p <= local_9b8.jstride._4_4_) {
                      lVar14 = 0;
                      do {
                        *(double *)(lVar6 + lVar14 * 8) =
                             *(double *)(lVar8 + lVar14 * 8) * *(double *)(lVar11 + lVar14 * 8);
                        lVar14 = lVar14 + 1;
                      } while ((local_9b8.jstride._4_4_ - (int)local_9b8.p) + 1 != (int)lVar14);
                    }
                    lVar7 = lVar7 + 1;
                    lVar6 = lVar6 + local_a40.jstride * 8;
                    lVar11 = lVar11 + local_750.super_FabArrayBase.boxarray.m_bat._0_8_ * 8;
                    lVar8 = lVar8 + (long)local_978.fabArray * 8;
                  } while ((int)local_9b8.kstride + 1 != (int)lVar7);
                }
                bVar15 = iVar4 != local_9b8.kstride._4_4_;
                iVar4 = iVar4 + 1;
              } while (bVar15);
            }
            lVar9 = lVar9 + 1;
            local_ae0 = local_ae0 + local_a40.nstride * 8;
            local_ad0 = local_ad0 + local_978._24_8_ * 8;
          } while (lVar9 != 3);
          amrex::MFIter::operator++((MFIter *)local_8d8);
        } while ((int)vStack_8c8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage < local_8b0);
      }
      amrex::MFIter::~MFIter((MFIter *)local_8d8);
      amrex::FillPatchIterator::~FillPatchIterator((FillPatchIterator *)local_240);
    }
  }
  iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
  if (iVar4 != 0) {
    local_9e0._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (this->super_AmrLevel).state.
         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
         super__Vector_impl_data._M_start[2].old_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
    iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
    amrex::FillPatchIterator::FillPatchIterator
              ((FillPatchIterator *)local_240,&this->super_AmrLevel,(MultiFab *)&local_3c0,
               (uint)(iVar4 != 0),time,0,3,NUM_SCALARS);
    iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
    src = getDsdt(this,(uint)(iVar4 != 0),time);
    iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
    amrex::MultiFab::Saxpy(dst,dt * 0.5,src,0,0,1,(uint)(iVar4 != 0));
    (*(src->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[1])(src);
    iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
    local_8d8._0_8_ =
         (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
    local_8d8._8_8_ = (FabArrayBase *)0x0;
    vStack_8c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_8c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_8c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::MultiFab
              ((MultiFab *)&local_750,bxs,dm,3,(uint)(iVar4 != 0),(MFInfo *)local_8d8,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_8c8);
    if ((be_cn_theta != 1.0) || (NAN(be_cn_theta))) {
      (*(this->super_AmrLevel)._vptr_AmrLevel[0x33])(time,this,&local_750,0,3);
    }
    else {
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&local_750,0.0,0,local_750.super_FabArrayBase.n_comp,
                 &local_750.super_FabArrayBase.n_grow);
    }
    amrex::MFIter::MFIter(&local_978,&local_548.super_FabArrayBase,true);
    if (local_978.currentIndex < local_978.endIndex) {
      do {
        iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
        amrex::MFIter::growntilebox(&local_9fc,&local_978,(uint)(iVar4 != 0));
        if (getForceVerbose != 0) {
          local_8d8._8_8_ = amrex::OutStream();
          local_8d8._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
          local_8d8._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_8c8);
          *(undefined8 *)
           ((long)&vStack_8c8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish +
           vStack_8c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
               *(undefined8 *)
                ((long)&(((BoxArray *)(local_8d8._8_8_ + 8))->m_bat).m_bat_type +
                (long)(*(_func_int ***)local_8d8._8_8_)[-3]);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_8c8,"---",3);
          local_a40.p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vStack_8c8,(char *)&local_a40,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vStack_8c8,"B - velocity advection:",0x17);
          local_a40.p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vStack_8c8,(char *)&local_a40,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vStack_8c8,"Calling getForce...",0x13);
          local_a40.p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vStack_8c8,(char *)&local_a40,1);
          amrex::Print::~Print((Print *)local_8d8);
        }
        piVar5 = &local_978.currentIndex;
        if (local_978.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar5 = ((local_978.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start + local_978.currentIndex;
        }
        iVar4 = *piVar5;
        (*(this->super_AmrLevel)._vptr_AmrLevel[0x2a])
                  (time,this,
                   local_3c0.m_fabs_v.
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar4],&local_9fc,0,3,
                   local_548.m_fabs_v.
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar4],
                   local_1b8.m_fabs_v.
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar4],0,&local_978);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_8d8,&local_3c0,&local_978,0);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&local_a40,&local_750,&local_978,0);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_9b8,
                   (FabArray<amrex::FArrayBox> *)
                   local_9e0._M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_978);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_918,&local_1b8,&local_978);
        iVar4 = do_mom_diff;
        lVar7 = (long)local_9fc.smallend.vect[1];
        lVar12 = (long)local_9fc.smallend.vect[0];
        lVar10 = CONCAT44(local_9b8.jstride._4_4_,(int)local_9b8.jstride) * 8;
        local_ad8 = (lVar7 - local_9b8.begin.y) * lVar10 + lVar12 * 8 + (long)local_9b8.begin.x * -8
                    + CONCAT44(local_9b8.p._4_4_,(int)local_9b8.p);
        local_9c8 = local_9b8.nstride * 8;
        local_ab0 = (lVar7 - local_a40.begin.y) * local_a40.jstride * 8 + lVar12 * 8 +
                    (long)local_a40.begin.x * -8 + CONCAT71(local_a40.p._1_7_,local_a40.p._0_1_);
        local_9d0 = local_a40.nstride * 8;
        local_ab8 = (lVar7 - vStack_8c8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                    local_8d8._8_8_ * 8 + lVar12 * 8 +
                    (long)(int)vStack_8c8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage * -8 +
                    local_8d8._0_8_;
        local_9d8 = (long)vStack_8c8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish * 8;
        lVar9 = 0;
        do {
          local_9c0 = lVar9;
          iVar2 = local_9fc.smallend.vect[2];
          if (local_9fc.smallend.vect[2] <= local_9fc.bigend.vect[2]) {
            do {
              if (local_9fc.smallend.vect[1] <= local_9fc.bigend.vect[1]) {
                lVar9 = (long)iVar2;
                lVar6 = (long)local_918.p +
                        (lVar9 - local_918.begin.z) * local_918.kstride * 8 +
                        (lVar7 - local_918.begin.y) * local_918.jstride * 8 + lVar12 * 8 +
                        (long)local_918.begin.x * -8;
                lVar8 = (lVar9 - local_9b8.begin.z) *
                        CONCAT44(local_9b8.kstride._4_4_,(int)local_9b8.kstride) * 8 + local_ad8;
                lVar14 = (lVar9 - local_a40.begin.z) * local_a40.kstride * 8 + local_ab0;
                lVar11 = (lVar9 - local_8b0) *
                         (long)vStack_8c8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start * 8 + local_ab8;
                lVar9 = lVar7;
                do {
                  if (local_9fc.smallend.vect[0] <= local_9fc.bigend.vect[0]) {
                    lVar13 = 0;
                    do {
                      dVar16 = (*(double *)(lVar11 + lVar13 * 8) + *(double *)(lVar14 + lVar13 * 8))
                               - *(double *)(lVar8 + lVar13 * 8);
                      *(double *)(lVar11 + lVar13 * 8) = dVar16;
                      if (iVar4 == 0) {
                        *(double *)(lVar11 + lVar13 * 8) = dVar16 / *(double *)(lVar6 + lVar13 * 8);
                      }
                      lVar13 = lVar13 + 1;
                    } while ((local_9fc.bigend.vect[0] - local_9fc.smallend.vect[0]) + 1 !=
                             (int)lVar13);
                  }
                  lVar9 = lVar9 + 1;
                  lVar6 = lVar6 + local_918.jstride * 8;
                  lVar8 = lVar8 + lVar10;
                  lVar14 = lVar14 + local_a40.jstride * 8;
                  lVar11 = lVar11 + local_8d8._8_8_ * 8;
                } while (local_9fc.bigend.vect[1] + 1 != (int)lVar9);
              }
              bVar15 = iVar2 != local_9fc.bigend.vect[2];
              iVar2 = iVar2 + 1;
            } while (bVar15);
          }
          local_ad8 = local_ad8 + local_9c8;
          local_ab0 = local_ab0 + local_9d0;
          local_ab8 = local_ab8 + local_9d8;
          lVar9 = local_9c0 + 1;
        } while (local_9c0 + 1 != 3);
        amrex::MFIter::operator++(&local_978);
      } while (local_978.currentIndex < local_978.endIndex);
    }
    amrex::MFIter::~MFIter(&local_978);
    amrex::MultiFab::~MultiFab((MultiFab *)&local_750);
    amrex::FillPatchIterator::~FillPatchIterator((FillPatchIterator *)local_240);
  }
  ComputeAofs(this,0,3,(MultiFab *)this_00,0,(MultiFab *)&local_3c0,dst,true,dt);
  (*(dst->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[1])();
  if (do_mom_diff != 0) {
    (*(this_00->super_FabArrayBase)._vptr_FabArrayBase[1])(this_00);
  }
  amrex::FillPatchIterator::~FillPatchIterator((FillPatchIterator *)local_5d0);
  amrex::MultiFab::~MultiFab((MultiFab *)&local_3c0);
  return;
}

Assistant:

void
NavierStokesBase::velocity_advection (Real dt)
{
    BL_PROFILE("NavierStokesBase::velocity_advection()");

    if (verbose)
    {
        if (do_mom_diff == 0)
        {

            amrex::Print() << "... advect velocities\n";
        }
        else
        {
            amrex::Print() << "... advect momenta\n";
        }
    }

    const Real  prev_time      = state[State_Type].prevTime();

    MultiFab* divu_fp = getDivCond(nghost_force(),prev_time);

    MultiFab forcing_term( grids, dmap, AMREX_SPACEDIM, nghost_force(), MFInfo(),Factory());
    forcing_term.setVal(0.0);

    FillPatchIterator U_fpi(*this,forcing_term, nghost_state(),prev_time,State_Type,Xvel,AMREX_SPACEDIM);
    MultiFab& Umf=U_fpi.get_mf();

    //
    // S_term is the state we are solving for: either velocity or momentum
    //
    MultiFab* S_term;

    S_term = (do_mom_diff)
        ? new MultiFab( grids, dmap, AMREX_SPACEDIM, nghost_state(), MFInfo(), Factory())
        : &Umf;

    if (do_mom_diff)
    {
        FillPatchIterator Rho_fpi(*this,forcing_term,nghost_state(),prev_time,State_Type,Density,1);
        MultiFab& Rmf=Rho_fpi.get_mf();

        for (MFIter U_mfi(Umf,TilingIfNotGPU()); U_mfi.isValid(); ++U_mfi)
        {
            auto const state_bx = U_mfi.growntilebox(nghost_state());

            auto const& dens = Rmf.const_array(U_mfi); //Previous time, nghost_state() grow cells filled
            auto const& vel  = Umf.const_array(U_mfi);
            auto const& st   = S_term->array(U_mfi);

            amrex::ParallelFor(state_bx, AMREX_SPACEDIM, [ dens, vel, st ]
            AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            { st(i,j,k,n) = vel(i,j,k,n) * dens(i,j,k); });
        }
    }

    //
    // Forcing term not used in MOL
    //
    if ( advection_scheme != "MOL" )
    {
        MultiFab& Gp = get_old_data(Gradp_Type);

        FillPatchIterator S_fpi(*this,forcing_term,nghost_force(),prev_time,State_Type,Density,NUM_SCALARS);
        MultiFab& Smf=S_fpi.get_mf();

	// Get divu to time n+1/2
        MultiFab* dsdt    = getDsdt(nghost_force(),prev_time);
        MultiFab::Saxpy(*divu_fp, 0.5*dt, *dsdt, 0, 0, 1, nghost_force());
        delete dsdt;

        MultiFab visc_terms(grids,dmap,AMREX_SPACEDIM,nghost_force(),MFInfo(),Factory());
        if (be_cn_theta != 1.0)
            getViscTerms(visc_terms,Xvel,AMREX_SPACEDIM,prev_time);
        else
            visc_terms.setVal(0.0);


#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter U_mfi(Umf,TilingIfNotGPU()); U_mfi.isValid(); ++U_mfi)
        {

            auto const force_bx = U_mfi.growntilebox(nghost_force()); // Box for forcing term

            if (getForceVerbose)
            {
                amrex::Print() << "---" << '\n'
                               << "B - velocity advection:" << '\n'
                               << "Calling getForce..." << '\n';
            }
            getForce(forcing_term[U_mfi],force_bx,Xvel,AMREX_SPACEDIM,
                     prev_time,Umf[U_mfi],Smf[U_mfi],0,U_mfi);

            //
            // Compute the total forcing.
            //
            auto const& tf   = forcing_term.array(U_mfi,Xvel);
            auto const& visc = visc_terms.const_array(U_mfi,Xvel);
            auto const& gp   = Gp.const_array(U_mfi);
            auto const& rho  = Smf.const_array(U_mfi); //Previous time, nghost_force() grow cells filled

            bool is_convective = do_mom_diff ? false : true;
            amrex::ParallelFor(force_bx, AMREX_SPACEDIM, [ tf, visc, gp, rho, is_convective]
            AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                tf(i,j,k,n) = ( tf(i,j,k,n) + visc(i,j,k,n) - gp(i,j,k,n) );
                if (is_convective)
                    tf(i,j,k,n) /= rho(i,j,k);
            });
        }
    }

    ComputeAofs( Xvel, AMREX_SPACEDIM, *S_term, 0, forcing_term, *divu_fp, true, dt );

    delete divu_fp;
    if (do_mom_diff)
        delete S_term;
}